

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

char * wabt::GetErrorLevelName(ErrorLevel error_level)

{
  char *pcStack_10;
  ErrorLevel error_level_local;
  
  if (error_level == Warning) {
    pcStack_10 = "warning";
  }
  else {
    pcStack_10 = "error";
  }
  return pcStack_10;
}

Assistant:

static WABT_INLINE const char* GetErrorLevelName(ErrorLevel error_level) {
  switch (error_level) {
    case ErrorLevel::Warning:
      return "warning";
    case ErrorLevel::Error:
      return "error";
  }
  WABT_UNREACHABLE;
}